

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::BeginTryTableExpr(NameApplier *this,TryTableExpr *expr)

{
  bool bVar1;
  Result result;
  reference this_00;
  string_view name;
  string_view label;
  TableCatch *catch_;
  iterator __end2;
  iterator __begin2;
  TryTableVector *__range2;
  TryTableExpr *expr_local;
  NameApplier *this_local;
  
  __end2 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::begin(&expr->catches);
  catch_ = (TableCatch *)
           std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::end(&expr->catches);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                                *)&catch_);
    if (!bVar1) {
      PushLabel(this,&(expr->block).label);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
              ::operator*(&__end2);
    bVar1 = TableCatch::IsCatchAll(this_00);
    if (!bVar1) {
      result = UseNameForTagVar(this,&this_00->tag);
      bVar1 = Failed(result);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    name = FindLabelByVar(this,&this_00->target);
    UseNameForVar(this,name,&this_00->target);
    __gnu_cxx::
    __normal_iterator<wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Result NameApplier::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      CHECK_RESULT(UseNameForTagVar(&catch_.tag));
    }
    std::string_view label = FindLabelByVar(&catch_.target);
    UseNameForVar(label, &catch_.target);
  }
  PushLabel(expr->block.label);
  return Result::Ok;
}